

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int find_keywd(ParseData *lParse,char *keyname,void *itslval)

{
  int iVar1;
  char *in_RDX;
  long in_RDI;
  long ival;
  int bval;
  double rval;
  fitsfile *fptr;
  char dtype;
  char keyvalue [71];
  int type;
  int status;
  FITS_PARSER_YYSTYPE *thelval;
  int *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  char cVar2;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 local_90;
  undefined1 local_79;
  char local_78 [16];
  int *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  fitsfile *in_stack_ffffffffffffffc8;
  int local_30;
  int local_4;
  
  iVar1 = ffgkey(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                 (char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 (int *)in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    iVar1 = ffdtyp((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    cVar2 = (char)in_stack_ffffffffffffff6c;
    if (iVar1 == 0) {
      switch(local_79) {
      case 0x43:
        ffgkys(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8
               ,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        local_30 = 0x105;
        strcpy(in_RDX,local_78);
        break;
      default:
        local_30 = -1;
        break;
      case 0x46:
        ffgkyd(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        local_30 = 0x104;
        *(undefined8 *)in_RDX = local_90;
        break;
      case 0x49:
        ffgkyj(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(long *)in_stack_ffffffffffffffa8
               ,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        local_30 = 0x103;
        *(char **)in_RDX = in_stack_ffffffffffffff60;
        break;
      case 0x4c:
        ffgkyl(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        local_30 = 0x102;
        *in_RDX = cVar2;
      }
      local_4 = local_30;
    }
    else {
      *(undefined4 *)(in_RDI + 0xe0) = 0;
      local_4 = -1;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0xe0) = 0;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int find_keywd(ParseData *lParse, char *keyname, void *itslval )
{
   FITS_PARSER_YYSTYPE *thelval = (FITS_PARSER_YYSTYPE*)itslval;
   int status, type;
   char keyvalue[FLEN_VALUE], dtype;
   fitsfile *fptr;
   double rval;
   int bval;
   long ival;

   status = 0;
   fptr = lParse->def_fptr;
   if( fits_read_keyword( fptr, keyname, keyvalue, NULL, &status ) ) {
      if( status == KEY_NO_EXIST ) {
         /*  Do this since ffgkey doesn't put an error message on stack  */
         snprintf(keyvalue,FLEN_VALUE, "ffgkey could not find keyword: %s",keyname);
         ffpmsg(keyvalue);
      }
      lParse->status = status;
      return( pERROR );
   }
      
   if( fits_get_keytype( keyvalue, &dtype, &status ) ) {
      lParse->status = status;
      return( pERROR );
   }

   /* Read appropriate value type and set to CONST_OP */
   switch( dtype ) {
   case 'C':
      fits_read_key_str( fptr, keyname, keyvalue, NULL, &status );
      type = STRING;
      strcpy( thelval->str , keyvalue );
      break;
   case 'L':
      fits_read_key_log( fptr, keyname, &bval, NULL, &status );
      type = BOOLEAN;
      thelval->log = bval;
      break;
   case 'I':
      fits_read_key_lng( fptr, keyname, &ival, NULL, &status );
      type = LONG;
      thelval->lng = ival;
      break;
   case 'F':
      fits_read_key_dbl( fptr, keyname, &rval, NULL, &status );
      type = DOUBLE;
      thelval->dbl = rval;
      break;
   default:
      type = pERROR;
      break;
   }

   if( status ) {
      lParse->status=status;
      return pERROR;
   }

   return( type );
}